

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRule>::moveAppend
          (QGenericArrayOps<QMimeMagicRule> *this,QMimeMagicRule *b,QMimeMagicRule *e)

{
  QMimeMagicRule *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QMimeMagicRule *in_RDI;
  QMimeMagicRule *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QMimeMagicRule>::begin
                        ((QArrayDataPointer<QMimeMagicRule> *)0x8f7ce7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QMimeMagicRule::QMimeMagicRule(this_00,in_RDI);
      local_10 = local_10 + 0x88;
      (in_RDI->m_subMatches).d.size = (in_RDI->m_subMatches).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }